

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyHexStrToInt64(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  char cVar1;
  uint uVar2;
  sxi32 sVar3;
  ushort **ppuVar4;
  ushort *puVar5;
  ushort *puVar6;
  int iVar7;
  long lVar8;
  ushort *puVar9;
  ushort *puVar10;
  ushort *puVar11;
  ushort *puVar12;
  bool bVar13;
  ushort *local_40;
  
  puVar12 = (ushort *)(zSrc + nLen);
  if (nLen != 0) {
    ppuVar4 = __ctype_b_loc();
    do {
      cVar1 = (char)*(ushort *)zSrc;
      if ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
        if ((cVar1 == '+') || (cVar1 == '-')) {
          bVar13 = cVar1 == '-';
          zSrc = (char *)((long)zSrc + 1);
          goto LAB_0011bafe;
        }
        break;
      }
      zSrc = (char *)((long)zSrc + 1);
    } while (zSrc < puVar12);
  }
  bVar13 = false;
LAB_0011bafe:
  puVar5 = puVar12 + -1;
  if (((zSrc < puVar5) && ((char)*(ushort *)zSrc == '0')) &&
     (uVar2 = *(byte *)((long)zSrc + 1) | 0x20, puVar5 = (ushort *)(ulong)uVar2, uVar2 == 0x78)) {
    zSrc = (char *)((long)zSrc + 2);
  }
  for (; (zSrc < puVar12 && ((char)*(ushort *)zSrc == '0')); zSrc = (char *)((long)zSrc + 1)) {
  }
  if (zSrc < puVar12) {
    ppuVar4 = __ctype_b_loc();
    puVar11 = *ppuVar4;
    lVar8 = 0;
    puVar6 = (ushort *)0x0;
    local_40 = (ushort *)zSrc;
    do {
      puVar5 = puVar11;
      if (((*(byte *)((long)puVar11 + (long)*(char *)((long)zSrc + lVar8) * 2 + 1) & 0x10) == 0) ||
         (iVar7 = (int)lVar8, 0xf < iVar7)) break;
      uVar2 = SyHexToint((int)*(char *)((long)zSrc + lVar8));
      puVar5 = (ushort *)(ulong)uVar2;
      puVar6 = (ushort *)((long)(int)uVar2 + (long)puVar6 * 0x10);
      puVar9 = (ushort *)(lVar8 + 1 + (long)zSrc);
      if (puVar12 <= puVar9) {
        puVar9 = (ushort *)((long)local_40 + 1);
        goto LAB_0011bca8;
      }
      puVar5 = (ushort *)(ulong)(iVar7 + 1U);
      if (0xf < (int)(iVar7 + 1U)) goto LAB_0011bca8;
      puVar5 = (ushort *)(ulong)(puVar11[(char)*puVar9] & 0x1000);
      if ((puVar11[(char)*puVar9] & 0x1000) == 0) goto LAB_0011bca8;
      uVar2 = SyHexToint((int)(char)*puVar9);
      puVar5 = (ushort *)(ulong)uVar2;
      puVar6 = (ushort *)((long)(int)uVar2 + (long)puVar6 * 0x10);
      puVar10 = (ushort *)(lVar8 + 2 + (long)zSrc);
      puVar9 = puVar10;
      if (((puVar12 <= puVar10) || (puVar5 = local_40 + 1, puVar9 = puVar5, 0xf < iVar7 + 2)) ||
         ((puVar11[(char)*puVar10] & 0x1000) == 0)) goto LAB_0011bca8;
      uVar2 = SyHexToint((int)(char)*puVar10);
      puVar5 = (ushort *)(ulong)uVar2;
      puVar6 = (ushort *)((long)(int)uVar2 + (long)puVar6 * 0x10);
      puVar9 = (ushort *)(lVar8 + 3 + (long)zSrc);
      if (puVar12 <= puVar9) {
        puVar9 = (ushort *)((long)local_40 + 3);
        goto LAB_0011bca8;
      }
      puVar5 = (ushort *)(ulong)(iVar7 + 3U);
      if (0xf < (int)(iVar7 + 3U)) goto LAB_0011bca8;
      puVar5 = (ushort *)(ulong)(puVar11[(char)*puVar9] & 0x1000);
      if ((puVar11[(char)*puVar9] & 0x1000) == 0) goto LAB_0011bca8;
      sVar3 = SyHexToint((int)(char)*puVar9);
      puVar6 = (ushort *)((long)sVar3 + (long)puVar6 * 0x10);
      local_40 = local_40 + 2;
      puVar5 = (ushort *)(lVar8 + 4 + (long)zSrc);
      lVar8 = lVar8 + 4;
    } while (puVar5 < puVar12);
    puVar9 = (ushort *)((long)zSrc + lVar8);
  }
  else {
    puVar6 = (ushort *)0x0;
    puVar9 = (ushort *)zSrc;
  }
LAB_0011bca8:
  if (puVar9 < puVar12) {
    ppuVar4 = __ctype_b_loc();
    puVar5 = *ppuVar4;
    do {
      puVar11 = (ushort *)((long)puVar9 + 1);
      if ((*(byte *)((long)puVar5 + (long)(char)*puVar9 * 2 + 1) & 0x20) == 0) break;
      puVar9 = puVar11;
    } while (puVar11 < puVar12);
  }
  if (pOutVal != (void *)0x0) {
    puVar5 = (ushort *)-(long)puVar6;
    if (puVar6 == (ushort *)0x0) {
      puVar5 = puVar6;
    }
    if (!bVar13) {
      puVar5 = puVar6;
    }
    *(ushort **)pOutVal = puVar5;
  }
  return (sxi32)puVar5;
}

Assistant:

JX9_PRIVATE sxi32 SyHexStrToInt64(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	const char *zIn, *zEnd;
	int isNeg = FALSE;
	sxi64 nVal = 0;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while( zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( *zSrc == '-' || *zSrc == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	if( zSrc < &zEnd[-2] && zSrc[0] == '0' && (zSrc[1] == 'x' || zSrc[1] == 'X') ){
		/* Bypass hex prefix */
		zSrc += sizeof(char) * 2;
	}	
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++;
	}
	zIn = zSrc;
	for(;;){
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
	}
	while( zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}	
	if( zRest ){
		*zRest = zSrc;
	}
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi64 *)pOutVal = nVal;
	}
	return zSrc >= zEnd ? SXRET_OK : SXERR_SYNTAX;
}